

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  byte bVar1;
  st_ptls_on_extension_t *psVar2;
  st_ptls_verify_certificate_t *psVar3;
  ushort uVar4;
  int iVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort *puVar11;
  uint8_t *puVar12;
  ushort *puVar13;
  ushort *puVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t certs [16];
  byte local_160 [8];
  ushort *local_158;
  uint *local_150;
  ulong local_148;
  ptls_t *local_140;
  ptls_iovec_t local_138 [16];
  
  if (end != src) {
    if ((uint8_t *)(ulong)*src <= end + ~(ulong)src) {
      if (*src != 0) {
        return 0x2f;
      }
      if ((uint8_t *)0x2 < end + ~(ulong)src) {
        lVar7 = 1;
        uVar9 = 0;
        do {
          uVar9 = (ulong)src[lVar7] | uVar9 << 8;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        puVar14 = (ushort *)(src + 4);
        if (uVar9 <= (ulong)((long)end - (long)puVar14)) {
          if (uVar9 == 0) {
            if (puVar14 != (ushort *)end) {
              return 0x32;
            }
          }
          else {
            local_148 = 0;
            local_150 = (uint *)got_certs;
            local_158 = (ushort *)(src + uVar9 + 4);
            do {
              if ((ulong)((long)local_158 - (long)puVar14) < 3) {
                return 0x32;
              }
              lVar7 = 0;
              uVar8 = 0;
              do {
                uVar8 = (ulong)*(byte *)((long)puVar14 + lVar7) | uVar8 << 8;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              puVar12 = (uint8_t *)((long)puVar14 + 3);
              if ((ulong)((long)local_158 - (long)puVar12) < uVar8) {
                return 0x32;
              }
              uVar10 = local_148;
              if (local_148 < 0x10) {
                uVar10 = local_148 + 1;
                local_138[local_148].base = puVar12;
                local_138[local_148].len = uVar8;
              }
              puVar13 = (ushort *)(puVar12 + uVar8);
              local_160[0] = 1;
              local_160[1] = 0x24;
              local_160[2] = 1;
              local_160[3] = 0;
              local_160[4] = 0;
              local_160[5] = 0x3e;
              local_160[6] = 8;
              local_160[7] = 0;
              if ((ulong)((long)local_158 - (long)puVar13) < 2) {
                return 0x32;
              }
              local_148 = uVar10;
              puVar11 = puVar13 + 1;
              uVar8 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
              if ((ulong)((long)local_158 - (long)puVar11) < uVar8) {
                return 0x32;
              }
              puVar14 = puVar11;
              if (uVar8 != 0) {
                puVar14 = (ushort *)((long)puVar13 + uVar8 + 2);
                local_140 = tls;
                do {
                  if ((long)puVar14 - (long)puVar11 < 2) {
                    return 0x32;
                  }
                  uVar4 = *puVar11;
                  bVar1 = *(byte *)((long)puVar11 + 1);
                  uVar6 = CONCAT11((char)uVar4,bVar1);
                  if (uVar6 < 0x40) {
                    if ((local_160[uVar6 >> 3] >> (uVar6 & 7) & 1) != 0) {
                      return 0x2f;
                    }
                    local_160[bVar1 >> 3] = local_160[bVar1 >> 3] | '\x01' << (bVar1 & 7);
                  }
                  if ((ulong)((long)puVar14 - (long)(puVar11 + 1)) < 2) {
                    return 0x32;
                  }
                  uVar6 = puVar11[1] << 8 | puVar11[1] >> 8;
                  puVar11 = puVar11 + 2;
                  if ((ulong)((long)puVar14 - (long)puVar11) < (ulong)uVar6) {
                    return 0x32;
                  }
                  psVar2 = tls->ctx->on_extension;
                  if ((psVar2 != (st_ptls_on_extension_t *)0x0) &&
                     (pVar15.len._0_2_ = uVar6, pVar15.base = (uint8_t *)puVar11,
                     pVar15.len._2_6_ = 0,
                     iVar5 = (*psVar2->cb)(psVar2,tls,'\v',CONCAT11((char)uVar4,bVar1),pVar15),
                     tls = local_140, iVar5 != 0)) {
                    return 1;
                  }
                  puVar11 = (ushort *)((long)puVar11 + (ulong)uVar6);
                } while (puVar11 != puVar14);
              }
              got_certs = (int *)local_150;
            } while (puVar14 != local_158);
            if (local_158 != (ushort *)end) {
              return 0x32;
            }
            psVar3 = tls->ctx->verify_certificate;
            if ((psVar3 != (st_ptls_verify_certificate_t *)0x0) &&
               (iVar5 = (*psVar3->cb)(psVar3,tls,&(tls->certificate_verify).cb,
                                      &(tls->certificate_verify).verify_ctx,local_138,local_148),
               iVar5 != 0)) {
              return iVar5;
            }
          }
          *got_certs = (uint)(uVar9 != 0);
          return 0;
        }
      }
    }
  }
  return 0x32;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < sizeof(certs) / sizeof(certs[0]))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (num_certs != 0 && tls->ctx->verify_certificate != NULL) {
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}